

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O3

IkSolutionBase<double> * __thiscall
ikfast::IkSolutionList<double>::GetSolution(IkSolutionList<double> *this,size_t index)

{
  _List_node_base *p_Var1;
  runtime_error *this_00;
  
  if ((this->_listsolutions).
      super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
      _M_impl._M_node._M_size <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"GetSolution index is invalid");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var1 = (this->_listsolutions).
           super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if ((long)index < 1) {
    if (index != 0) {
      do {
        p_Var1 = p_Var1->_M_prev;
        index = index + 1;
      } while (index != 0);
    }
  }
  else {
    do {
      p_Var1 = p_Var1->_M_next;
      index = index - 1;
    } while (index != 0);
  }
  return (IkSolutionBase<double> *)(p_Var1 + 1);
}

Assistant:

virtual const IkSolutionBase<T>& GetSolution(size_t index) const
    {
        if( index >= _listsolutions.size() ) {
            throw std::runtime_error("GetSolution index is invalid");
        }
        typename std::list< IkSolution<T> >::const_iterator it = _listsolutions.begin();
        std::advance(it,index);
        return *it;
    }